

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O3

void Gluco::sort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  CRef *pCVar1;
  CRef y;
  uint uVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  uint *array_00;
  long lVar6;
  reduceDB_lt local_40;
  int local_34;
  
  local_40.ca = lt.ca;
  if (size < 0x10) {
    selectionSort<unsigned_int,reduceDB_lt>(array,size,lt);
    return;
  }
  y = array[(uint)size >> 1];
  lVar6 = -1;
  uVar5 = (ulong)(uint)size;
  local_34 = size;
  while( true ) {
    lVar6 = (long)(int)lVar6;
    array_00 = array + lVar6;
    do {
      lVar6 = lVar6 + 1;
      pCVar1 = array_00 + 1;
      array_00 = array_00 + 1;
      bVar4 = reduceDB_lt::operator()(&local_40,*pCVar1,y);
    } while (bVar4);
    uVar5 = (ulong)(int)uVar5;
    do {
      lVar3 = uVar5 - 1;
      uVar5 = uVar5 - 1;
      bVar4 = reduceDB_lt::operator()(&local_40,y,array[lVar3]);
    } while (bVar4);
    if ((long)uVar5 <= lVar6) break;
    uVar2 = *array_00;
    *array_00 = array[uVar5];
    array[uVar5] = uVar2;
  }
  sort<unsigned_int,reduceDB_lt>(array,(int)lVar6,local_40);
  sort<unsigned_int,reduceDB_lt>(array_00,local_34 - (int)lVar6,local_40);
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}